

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::ByteSizeLong
          (CategoricalCrossEntropyLossLayer *this)

{
  string *psVar1;
  size_t sVar2;
  size_t sVar3;
  
  psVar1 = (this->input_).ptr_;
  if (psVar1->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar2 = sVar2 + 1;
  }
  psVar1 = (this->target_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar2 = sVar2 + sVar3 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t CategoricalCrossEntropyLossLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  size_t total_size = 0;

  // string input = 1;
  if (this->input().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->input());
  }

  // string target = 2;
  if (this->target().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->target());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}